

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<5>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  RepeatedField<int> *array;
  int i;
  long lVar1;
  long lVar2;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32 *)((long)field + 0x10),output);
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < *field; lVar1 = lVar1 + 1) {
      OutputHelper<google::protobuf::internal::ArrayOutput,_5>::Serialize
                ((void *)(*(long *)((long)field + 8) + lVar2),output);
      lVar2 = lVar2 + 4;
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}